

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<VCProjectSingleConfig>::emplace<VCProjectSingleConfig_const&>
          (QMovableArrayOps<VCProjectSingleConfig> *this,qsizetype i,VCProjectSingleConfig *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<VCProjectSingleConfig> *in_RSI;
  QArrayDataPointer<VCProjectSingleConfig> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  VCProjectSingleConfig tmp;
  VCProjectSingleConfig *in_stack_ffffffffffffc588;
  undefined7 in_stack_ffffffffffffc590;
  undefined1 in_stack_ffffffffffffc597;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffc5a4;
  byte bVar6;
  GrowthPosition where;
  Inserter local_3a40;
  undefined1 local_3a18 [14864];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<VCProjectSingleConfig>::needsDetach
                    ((QArrayDataPointer<VCProjectSingleConfig> *)
                     CONCAT17(in_stack_ffffffffffffc597,in_stack_ffffffffffffc590));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<VCProjectSingleConfig> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<VCProjectSingleConfig>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<VCProjectSingleConfig>::end
                ((QArrayDataPointer<VCProjectSingleConfig> *)
                 CONCAT17(in_stack_ffffffffffffc597,in_stack_ffffffffffffc590));
      VCProjectSingleConfig::VCProjectSingleConfig
                ((VCProjectSingleConfig *)
                 CONCAT17(in_stack_ffffffffffffc597,in_stack_ffffffffffffc590),
                 in_stack_ffffffffffffc588);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00257804;
    }
    if ((in_RSI == (QArrayDataPointer<VCProjectSingleConfig> *)0x0) &&
       (qVar3 = QArrayDataPointer<VCProjectSingleConfig>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<VCProjectSingleConfig>::begin
                ((QArrayDataPointer<VCProjectSingleConfig> *)0x2576ca);
      VCProjectSingleConfig::VCProjectSingleConfig
                ((VCProjectSingleConfig *)
                 CONCAT17(in_stack_ffffffffffffc597,in_stack_ffffffffffffc590),
                 in_stack_ffffffffffffc588);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00257804;
    }
  }
  memset(local_3a18,0xaa,0x3a10);
  VCProjectSingleConfig::VCProjectSingleConfig
            ((VCProjectSingleConfig *)CONCAT17(in_stack_ffffffffffffc597,in_stack_ffffffffffffc590),
             in_stack_ffffffffffffc588);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<VCProjectSingleConfig> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<VCProjectSingleConfig> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<VCProjectSingleConfig>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffc5a4,uVar2))),
             (VCProjectSingleConfig **)in_RDI,
             (QArrayDataPointer<VCProjectSingleConfig> *)CONCAT17(uVar5,in_stack_ffffffffffffc590));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter((Inserter *)
                       CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffc5a4,uVar2))),
                       in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffc590),
                       (qsizetype)in_stack_ffffffffffffc588);
    Inserter::insertOne((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffc590),
                        in_stack_ffffffffffffc588);
    Inserter::~Inserter(&local_3a40);
  }
  else {
    QArrayDataPointer<VCProjectSingleConfig>::begin
              ((QArrayDataPointer<VCProjectSingleConfig> *)0x257792);
    VCProjectSingleConfig::VCProjectSingleConfig
              ((VCProjectSingleConfig *)CONCAT17(uVar5,in_stack_ffffffffffffc590),
               in_stack_ffffffffffffc588);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  VCProjectSingleConfig::~VCProjectSingleConfig
            ((VCProjectSingleConfig *)CONCAT17(uVar5,in_stack_ffffffffffffc590));
LAB_00257804:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }